

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  undefined8 *puVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0x10;
  do {
    puVar1 = (undefined8 *)((long)&this->params[0].loaded + lVar4);
    *(undefined4 *)(puVar1 + -2) = 0;
    piVar2 = (int *)*puVar1;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (lVar3 = puVar1[-1], lVar3 != 0)) {
        free(*(void **)(lVar3 + -8));
      }
    }
    puVar1[3] = 0;
    puVar1[4] = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[-1] = 0;
    *puVar1 = 0;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0x470);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}